

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O2

XMLSize_t __thiscall
xercesc_4_0::ICUTranscoder::transcodeTo
          (ICUTranscoder *this,XMLCh *srcData,XMLSize_t srcCount,XMLByte *toFill,XMLSize_t maxBytes,
          XMLSize_t *charsEaten,UnRepOpts options)

{
  bool bVar1;
  TranscodingException *this_00;
  XMLSize_t XVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  undefined8 in_stack_ffffffffffffff48;
  uint uVar6;
  UErrorCode err;
  UChar *startSrc;
  UConverterFromUCallback oldCB;
  XMLSize_t *local_88;
  XMLByte *startTarget;
  void *orgContent;
  ArrayJanitor<char16_t> janTmpBuf;
  UConverterFromUCallback orgAction;
  XMLCh tmpBuf [17];
  
  uVar6 = (uint)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_88 = charsEaten;
  ArrayJanitor<char16_t>::ArrayJanitor
            (&janTmpBuf,(char16_t *)0x0,(this->super_XMLTranscoder).fMemoryManager);
  err = U_ZERO_ERROR;
  oldCB = (UConverterFromUCallback)0x0;
  if (options == UnRep_Throw) {
    pcVar3 = UCNV_FROM_U_CALLBACK_STOP_70;
  }
  else {
    pcVar3 = UCNV_FROM_U_CALLBACK_SUBSTITUTE_70;
  }
  ucnv_setFromUCallBack_70(this->fConverter,pcVar3,0,&oldCB,&orgContent,&err);
  err = U_ZERO_ERROR;
  startSrc = srcData;
  startTarget = toFill;
  ucnv_fromUnicode_70(this->fConverter,&startTarget,toFill + maxBytes,&startSrc,srcData + srcCount,0
                      ,(ulong)uVar6 << 0x20,&err);
  bVar4 = err == U_ZERO_ERROR;
  bVar5 = err == U_BUFFER_OVERFLOW_ERROR;
  bVar1 = srcData < startSrc;
  err = U_ZERO_ERROR;
  orgAction = (UConverterFromUCallback)0x0;
  ucnv_setFromUCallBack_70(this->fConverter,oldCB,0,&orgAction,&orgContent);
  if (bVar4 || bVar1 && bVar5) {
    *local_88 = (long)startSrc - (long)srcData >> 1;
    XVar2 = (long)startTarget - (long)toFill;
    ArrayJanitor<char16_t>::~ArrayJanitor(&janTmpBuf);
    return XVar2;
  }
  XMLString::binToText
            ((uint)(ushort)*startSrc,tmpBuf,0x10,0x10,(this->super_XMLTranscoder).fMemoryManager);
  this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
  TranscodingException::TranscodingException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/Transcoders/ICU/ICUTransService.cpp"
             ,0x2b2,Trans_Unrepresentable,tmpBuf,(this->super_XMLTranscoder).fEncodingName,
             (XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLTranscoder).fMemoryManager);
  __cxa_throw(this_00,&TranscodingException::typeinfo,XMLException::~XMLException);
}

Assistant:

XMLSize_t
ICUTranscoder::transcodeTo( const   XMLCh* const    srcData
                            , const XMLSize_t       srcCount
                            ,       XMLByte* const  toFill
                            , const XMLSize_t       maxBytes
                            ,       XMLSize_t&      charsEaten
                            , const UnRepOpts       options)
{
    //
    //  Get a pointer to the buffer to transcode. If UChar and XMLCh are
    //  the same size here, then use the original. Else, create a temp
    //  one and put a janitor on it.
    //
    const UChar* srcPtr;
    UChar* tmpBufPtr = 0;
    if (sizeof(XMLCh) == sizeof(UChar))
    {
        srcPtr = (const UChar*)srcData;
    }
    else
    {
        tmpBufPtr = convertToUChar(srcData, srcCount, getMemoryManager());
        srcPtr = tmpBufPtr;
    }
    ArrayJanitor<UChar> janTmpBuf(tmpBufPtr, getMemoryManager());

    //
    //  Set the appropriate callback so that it will either fail or use
    //  the rep char. Remember the old one so we can put it back.
    //
    UErrorCode  err = U_ZERO_ERROR;
    UConverterFromUCallback oldCB = NULL;
    #if (U_ICU_VERSION_MAJOR_NUM < 2)
    void* orgContent;
    #else
    const void* orgContent;
    #endif
    ucnv_setFromUCallBack
    (
        fConverter
        , (options == UnRep_Throw) ? UCNV_FROM_U_CALLBACK_STOP
                                   : UCNV_FROM_U_CALLBACK_SUBSTITUTE
        , NULL
        , &oldCB
        , &orgContent
        , &err
    );

    //
    //  Ok, lets transcode as many chars as we we can in one shot. The
    //  ICU API gives enough info not to have to do this one char by char.
    //
    XMLByte*        startTarget = toFill;
    const UChar*    startSrc = srcPtr;
    err = U_ZERO_ERROR;
    ucnv_fromUnicode
    (
        fConverter
        , (char**)&startTarget
        , (char*)(startTarget + maxBytes)
        , &startSrc
        , srcPtr + srcCount
        , 0
        , false
        , &err
    );

    // Rememember the status before we possibly overite the error code
    const bool res = ((err == U_ZERO_ERROR) || (err == U_BUFFER_OVERFLOW_ERROR && startSrc > srcPtr));

    // Put the old handler back
    err = U_ZERO_ERROR;
    UConverterFromUCallback orgAction = NULL;

    ucnv_setFromUCallBack(fConverter, oldCB, NULL, &orgAction, &orgContent, &err);

    if (!res)
    {
        XMLCh tmpBuf[17];
        XMLString::binToText((unsigned int)*startSrc, tmpBuf, 16, 16, getMemoryManager());
        ThrowXMLwithMemMgr2
        (
            TranscodingException
            , XMLExcepts::Trans_Unrepresentable
            , tmpBuf
            , getEncodingName()
            , getMemoryManager()
        );
    }

    // Fill in the chars we ate from the input
    charsEaten = startSrc - srcPtr;

    // Return the chars we stored
    return startTarget - toFill;
}